

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrLib.c
# Opt level: O2

void Rwr_Trav_rec(Rwr_Man_t *p,Rwr_Node_t *pNode,int *pVolume)

{
  int iVar1;
  
  for (; ((pNode->field_0x11 & 0x40) == 0 && (pNode->TravId != p->nTravIds));
      pNode = (Rwr_Node_t *)((ulong)pNode->p1 & 0xfffffffffffffffe)) {
    pNode->TravId = p->nTravIds;
    iVar1 = *pVolume;
    *pVolume = iVar1 + 1;
    if (*(int *)&pNode->field_0xe < 0) {
      *pVolume = iVar1 + 2;
    }
    Rwr_Trav_rec(p,(Rwr_Node_t *)((ulong)pNode->p0 & 0xfffffffffffffffe),pVolume);
  }
  return;
}

Assistant:

void Rwr_Trav_rec( Rwr_Man_t * p, Rwr_Node_t * pNode, int * pVolume )
{
    if ( pNode->fUsed || pNode->TravId == p->nTravIds )
        return;
    pNode->TravId = p->nTravIds;
    (*pVolume)++;
    if ( pNode->fExor )
        (*pVolume)++;
    Rwr_Trav_rec( p, Rwr_Regular(pNode->p0), pVolume );
    Rwr_Trav_rec( p, Rwr_Regular(pNode->p1), pVolume );
}